

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O2

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeHalfedgeVectorsInVertex
          (IntrinsicGeometryInterface *this)

{
  double dVar1;
  bool bVar2;
  ulong uVar3;
  Vector2 *pVVar4;
  pointer puVar5;
  ParentMeshT *pPVar6;
  runtime_error *this_00;
  size_t i;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double local_a8;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> __begin2;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> __end2;
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2> local_68;
  
  if (((this->super_BaseGeometryInterface).mesh)->useImplicitTwinFlag == false) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (this_00,
               "ERROR: Tangent spaces not implemented for general SurfaceMesh, use ManifoldSurfaceMesh"
              );
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  DependentQuantity::ensureHave(&(this->edgeLengthsQ).super_DependentQuantity);
  DependentQuantity::ensureHave(&(this->cornerScaledAnglesQ).super_DependentQuantity);
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2>::MeshData
            (&local_68,(this->super_BaseGeometryInterface).mesh);
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2>::operator=
            (&this->halfedgeVectorsInVertex,&local_68);
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2>::~MeshData(&local_68);
  local_68.mesh = (this->super_BaseGeometryInterface).mesh;
  local_68.defaultValue.y = (double)(local_68.mesh)->nVerticesFillCount;
  local_68.defaultValue.x = 0.0;
  RangeSetBase<geometrycentral::surface::VertexRangeF>::begin
            (&__begin2,(RangeSetBase<geometrycentral::surface::VertexRangeF> *)&local_68);
  RangeSetBase<geometrycentral::surface::VertexRangeF>::end
            (&__end2,(RangeSetBase<geometrycentral::surface::VertexRangeF> *)&local_68);
  do {
    pPVar6 = __begin2.mesh;
    if (__begin2.iCurr == __end2.iCurr) {
      return;
    }
    local_a8 = 0.0;
    uVar3 = ((__begin2.mesh)->vHalfedgeArr).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[__begin2.iCurr];
    uVar8 = uVar3;
    do {
      dVar9 = cos(local_a8);
      dVar10 = sin(local_a8);
      bVar2 = pPVar6->useImplicitTwinFlag;
      if (bVar2 == true) {
        uVar7 = uVar8 >> 1;
      }
      else {
        uVar7 = (pPVar6->heEdgeArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar8];
      }
      dVar1 = (this->edgeLengths).data.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar7]
      ;
      pVVar4 = (this->halfedgeVectorsInVertex).data.
               super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      pVVar4[uVar8].x = dVar1 * dVar9;
      pVVar4[uVar8].y = dVar10 * dVar1;
      if (pPVar6->nFacesFillCount <=
          (pPVar6->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar8]) break;
      puVar5 = (pPVar6->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = puVar5[puVar5[uVar8]];
      if (bVar2 == false) {
        uVar7 = (pPVar6->heSiblingArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7];
      }
      else {
        uVar7 = uVar7 ^ 1;
      }
      local_a8 = local_a8 +
                 (this->cornerScaledAngles).data.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar8];
      uVar8 = uVar7;
    } while (uVar7 != uVar3);
    RangeIteratorBase<geometrycentral::surface::VertexRangeF>::operator++(&__begin2);
  } while( true );
}

Assistant:

void IntrinsicGeometryInterface::computeHalfedgeVectorsInVertex() {

  if (!mesh.usesImplicitTwin()) {
    throw std::runtime_error("ERROR: Tangent spaces not implemented for general SurfaceMesh, use ManifoldSurfaceMesh");
  }

  edgeLengthsQ.ensureHave();
  cornerScaledAnglesQ.ensureHave();

  halfedgeVectorsInVertex = HalfedgeData<Vector2>(mesh);

  for (Vertex v : mesh.vertices()) {
    double coordSum = 0.0;

    // Custom loop to orbit CCW
    Halfedge firstHe = v.halfedge();
    Halfedge currHe = firstHe;
    do {
      halfedgeVectorsInVertex[currHe] = Vector2::fromAngle(coordSum) * edgeLengths[currHe.edge()];
      coordSum += cornerScaledAngles[currHe.corner()];
      if (!currHe.isInterior()) break;
      currHe = currHe.next().next().twin();
    } while (currHe != firstHe);
  }
}